

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

void crnlib::FillDistancesPrices(CLzmaEnc *p)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  UInt32 (*paUVar6) [128];
  UInt32 UVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  CLzmaEnc *pCVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  int aiStack_228 [126];
  
  lVar5 = 4;
  do {
    bVar1 = p->g_FastPos[lVar5];
    iVar4 = (bVar1 >> 1) - 1;
    bVar2 = (byte)iVar4 & 0x1f;
    uVar8 = (bVar1 & 1 | 2) << bVar2;
    if (iVar4 == 0) {
      iVar9 = 0;
    }
    else {
      uVar10 = (int)lVar5 - uVar8;
      iVar9 = 0 << bVar2;
      uVar14 = 1;
      do {
        uVar12 = uVar10 & 1;
        uVar3 = (ulong)uVar14;
        uVar14 = uVar12 + uVar14 * 2;
        uVar10 = uVar10 >> 1;
        iVar9 = iVar9 + p->ProbPrices
                        [(-uVar12 & 0x7f0 ^
                         (uint)*(ushort *)
                                ((long)p +
                                uVar3 * 2 + ((ulong)uVar8 * 2 - (ulong)((uint)bVar1 * 2)) + 0x34146)
                         ) >> 4];
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    aiStack_228[lVar5 + -4] = iVar9;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x80);
  paUVar6 = p->distancesPrices;
  lVar5 = 0;
  lVar13 = 0;
  pCVar11 = p;
  do {
    if (p->distTableSize != 0) {
      uVar3 = 0;
      do {
        UVar7 = 0;
        uVar8 = (uint)uVar3 | 0x40;
        do {
          uVar14 = uVar8 >> 1;
          UVar7 = UVar7 + p->ProbPrices
                          [(-(uVar8 & 1) & 0x7f0 ^
                           (uint)*(ushort *)
                                  ((long)p->posSlotEncoder[lVar13] + (ulong)(uVar8 & 0xfffffffe)))
                           >> 4];
          uVar8 = uVar14;
        } while (uVar14 != 1);
        p->posSlotPrices[lVar13][uVar3] = UVar7;
        uVar3 = uVar3 + 1;
      } while (uVar3 < p->distTableSize);
    }
    if (0xe < p->distTableSize) {
      uVar8 = 0x70;
      lVar15 = 0xcbef;
      do {
        *(uint *)((long)&(pCVar11->matchFinder).Init + lVar15 * 4) =
             (uVar8 & 0xfffffff0) + *(int *)((long)&(pCVar11->matchFinder).Init + lVar15 * 4) +
             -0x50;
        uVar8 = uVar8 + 8;
        uVar3 = lVar15 - 0xcbe0;
        lVar15 = lVar15 + 1;
      } while (uVar3 < p->distTableSize);
    }
    lVar15 = 0;
    do {
      (*paUVar6)[lVar15] = pCVar11->posSlotPrices[0][lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    lVar15 = 0;
    do {
      *(UInt32 *)((long)p->distancesPrices[0] + lVar15 * 4 + lVar5 + 0x10) =
           aiStack_228[lVar15] + p->posSlotPrices[lVar13][p->g_FastPos[lVar15 + 4]];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x7c);
    lVar13 = lVar13 + 1;
    pCVar11 = (CLzmaEnc *)((pCVar11->matchFinderBase).crc + 0x11);
    paUVar6 = paUVar6 + 1;
    lVar5 = lVar5 + 0x200;
  } while (lVar13 != 4);
  p->matchPriceCount = 0;
  return;
}

Assistant:

static void FillDistancesPrices(CLzmaEnc* p) {
  UInt32 tempPrices[kNumFullDistances];
  UInt32 i, lenToPosState;
  for (i = kStartPosModelIndex; i < kNumFullDistances; i++) {
    UInt32 posSlot = GetPosSlot1(i);
    UInt32 footerBits = ((posSlot >> 1) - 1);
    UInt32 base = ((2 | (posSlot & 1)) << footerBits);
    tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base - posSlot - 1, footerBits, i - base, p->ProbPrices);
  }

  for (lenToPosState = 0; lenToPosState < kNumLenToPosStates; lenToPosState++) {
    UInt32 posSlot;
    const CLzmaProb* encoder = p->posSlotEncoder[lenToPosState];
    UInt32* posSlotPrices = p->posSlotPrices[lenToPosState];
    for (posSlot = 0; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] = RcTree_GetPrice(encoder, kNumPosSlotBits, posSlot, p->ProbPrices);
    for (posSlot = kEndPosModelIndex; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] += ((((posSlot >> 1) - 1) - kNumAlignBits) << kNumBitPriceShiftBits);

    {
      UInt32* distancesPrices = p->distancesPrices[lenToPosState];
      UInt32 i;
      for (i = 0; i < kStartPosModelIndex; i++)
        distancesPrices[i] = posSlotPrices[i];
      for (; i < kNumFullDistances; i++)
        distancesPrices[i] = posSlotPrices[GetPosSlot1(i)] + tempPrices[i];
    }
  }
  p->matchPriceCount = 0;
}